

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_field_presence_test.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::NoFieldPresenceSwapFieldTest::NoFieldPresenceSwapFieldTest
          (NoFieldPresenceSwapFieldTest *this)

{
  Metadata MVar1;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__NoFieldPresenceSwapFieldTest_018b0668;
  proto2_nofieldpresence_unittest::TestAllTypes::TestAllTypes(&this->m1_,(Arena *)0x0);
  proto2_nofieldpresence_unittest::TestAllTypes::TestAllTypes(&this->m2_,(Arena *)0x0);
  MVar1 = proto2_nofieldpresence_unittest::TestAllTypes::GetMetadata
                    ((TestAllTypes *)
                     proto2_nofieldpresence_unittest::_TestAllTypes_default_instance_);
  this->r1_ = MVar1.reflection;
  MVar1 = proto2_nofieldpresence_unittest::TestAllTypes::GetMetadata
                    ((TestAllTypes *)
                     proto2_nofieldpresence_unittest::_TestAllTypes_default_instance_);
  this->r2_ = MVar1.reflection;
  MVar1 = proto2_nofieldpresence_unittest::TestAllTypes::GetMetadata
                    ((TestAllTypes *)
                     proto2_nofieldpresence_unittest::_TestAllTypes_default_instance_);
  this->d1_ = MVar1.descriptor;
  MVar1 = proto2_nofieldpresence_unittest::TestAllTypes::GetMetadata
                    ((TestAllTypes *)
                     proto2_nofieldpresence_unittest::_TestAllTypes_default_instance_);
  this->d2_ = MVar1.descriptor;
  return;
}

Assistant:

NoFieldPresenceSwapFieldTest()
      : m1_(),
        m2_(),
        r1_(m1_.GetReflection()),
        r2_(m2_.GetReflection()),
        d1_(m1_.GetDescriptor()),
        d2_(m2_.GetDescriptor()) {}